

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(Registry *this,uint64_t aXpan)

{
  Status local_79;
  undefined1 local_78 [7];
  Status status;
  Network nwk;
  uint64_t aXpan_local;
  Registry *this_local;
  
  nwk._88_8_ = aXpan;
  Network::Network((Network *)local_78);
  local_79 = GetNetworkByXpan(this,nwk._88_8_,(Network *)local_78);
  if (local_79 == kSuccess) {
    local_79 = SetCurrentNetwork(this,(NetworkId *)local_78);
  }
  Network::~Network((Network *)local_78);
  return local_79;
}

Assistant:

Registry::Status Registry::SetCurrentNetwork(uint64_t aXpan)
{
    Network          nwk;
    Registry::Status status;

    VerifyOrExit((status = GetNetworkByXpan(aXpan, nwk)) == Registry::Status::kSuccess);
    status = SetCurrentNetwork(nwk.mId);
exit:
    return status;
}